

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O3

bool __thiscall
google::protobuf::MessageLite::ParsePartialFromIstream(MessageLite *this,istream *input)

{
  bool bVar1;
  IstreamInputStream zero_copy_input;
  IstreamInputStream local_60;
  
  io::IstreamInputStream::IstreamInputStream(&local_60,input,-1);
  (*this->_vptr_MessageLite[7])(this);
  bVar1 = internal::MergePartialFromImpl<false>(&local_60.super_ZeroCopyInputStream,this);
  if (bVar1) {
    bVar1 = (bool)(((byte)input[*(long *)(*(long *)input + -0x18) + 0x20] & 2) >> 1);
  }
  else {
    bVar1 = false;
  }
  local_60.super_ZeroCopyInputStream._vptr_ZeroCopyInputStream =
       (_func_int **)&PTR__IstreamInputStream_0046d230;
  io::CopyingInputStreamAdaptor::~CopyingInputStreamAdaptor(&local_60.impl_);
  io::IstreamInputStream::CopyingIstreamInputStream::~CopyingIstreamInputStream
            (&local_60.copying_input_);
  return bVar1;
}

Assistant:

bool MessageLite::ParsePartialFromIstream(std::istream* input) {
  io::IstreamInputStream zero_copy_input(input);
  return ParsePartialFromZeroCopyStream(&zero_copy_input) && input->eof();
}